

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import_writer.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::objectivec::ImportWriter::PrintRuntimeImports
          (ImportWriter *this,Printer *p,bool default_cpp_symbol)

{
  initializer_list<google::protobuf::io::Printer::Sub> v;
  initializer_list<google::protobuf::io::Printer::Sub> v_00;
  initializer_list<google::protobuf::io::Printer::Sub> v_01;
  Printer *pPVar1;
  bool bVar2;
  ulong uVar3;
  LogMessage *pLVar4;
  char *in_RCX;
  string_view framework_name;
  Sub *local_9e0;
  Sub *local_950;
  Sub *local_8f0;
  basic_string_view<char,_std::char_traits<char>_> local_8b8;
  undefined1 local_8a1;
  anon_class_16_2_fd512ddd_for_cb local_8a0;
  allocator<char> local_889;
  string local_888;
  anon_class_16_2_fd512ddd_for_cb local_868;
  allocator<char> local_851;
  string local_850;
  allocator<char> local_829;
  string local_828;
  anon_class_16_2_4966c0c9_for_cb local_808;
  allocator<char> local_7f1;
  string local_7f0;
  basic_string_view<char,_std::char_traits<char>_> local_7d0;
  string local_7c0;
  allocator<char> local_799;
  string local_798;
  Sub *local_778;
  Sub local_770;
  Sub local_6b8;
  Sub local_600;
  Sub local_548;
  Sub local_490;
  iterator local_3d8;
  size_type local_3d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_3c8;
  basic_string_view<char,_std::char_traits<char>_> local_3b0;
  undefined1 local_39a;
  allocator<char> local_399;
  string local_398;
  undefined8 local_378;
  Sub local_370;
  iterator local_2b8;
  size_type local_2b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_2a8;
  undefined1 local_298 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header_1;
  const_iterator __end4_1;
  const_iterator __begin4_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4_1;
  basic_string_view<char,_std::char_traits<char>_> local_270;
  LogMessageFatal local_260 [21];
  Voidify local_24b [3];
  undefined1 local_248 [24];
  string local_230;
  allocator<char> local_1f9;
  string local_1f8;
  Sub *local_1d8;
  Sub local_1d0;
  Sub local_118;
  iterator local_60;
  size_type local_58;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_50;
  undefined1 local_40 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *header;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range4;
  Printer *pPStack_18;
  bool default_cpp_symbol_local;
  Printer *p_local;
  ImportWriter *this_local;
  
  __range4._7_1_ = default_cpp_symbol;
  pPStack_18 = p;
  p_local = (Printer *)this;
  uVar3 = std::__cxx11::string::empty();
  pPVar1 = pPStack_18;
  if ((uVar3 & 1) == 0) {
    __end4 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(&this->protobuf_imports_);
    header = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(&this->protobuf_imports_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end4,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&header), bVar2) {
      local_40 = (undefined1  [8])
                 __gnu_cxx::
                 __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator*(&__end4);
      pPVar1 = pPStack_18;
      local_248[0x16] = 1;
      local_1d8 = &local_1d0;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1f8,"import_prefix",&local_1f9);
      io::Printer::Sub::Sub<std::__cxx11::string_const&>
                (&local_1d0,&local_1f8,&this->runtime_import_prefix_);
      local_1d8 = &local_118;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_230,"header",(allocator<char> *)(local_248 + 0x17));
      io::Printer::Sub::Sub<std::__cxx11::string_const&>
                (&local_118,&local_230,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      local_248[0x16] = 0;
      local_60 = &local_1d0;
      local_58 = 2;
      v_01._M_len = 2;
      v_01._M_array = local_60;
      absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_50._M_local_buf,v_01);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)local_248,
                 "\n                #import \"$import_prefix$/$header$\"\n              ");
      io::Printer::SourceLocation::current();
      google::protobuf::io::Printer::Emit
                (pPVar1,local_50._M_allocated_capacity,local_50._8_8_,local_248._0_8_,
                 local_248._8_8_);
      local_8f0 = (Sub *)&local_60;
      do {
        local_8f0 = local_8f0 + -1;
        io::Printer::Sub::~Sub(local_8f0);
      } while (local_8f0 != &local_1d0);
      std::__cxx11::string::~string((string *)&local_230);
      std::allocator<char>::~allocator((allocator<char> *)(local_248 + 0x17));
      std::__cxx11::string::~string((string *)&local_1f8);
      std::allocator<char>::~allocator(&local_1f9);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end4);
    }
  }
  else if ((this->for_bundled_proto_ & 1U) == 0) {
    local_8a1 = 1;
    local_778 = &local_770;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_798,"cpp_symbol",&local_799)
    ;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_7d0,"Protobuf");
    framework_name._M_str = in_RCX;
    framework_name._M_len = (size_t)local_7d0._M_str;
    ProtobufFrameworkImportSymbol_abi_cxx11_
              (&local_7c0,(objectivec *)local_7d0._M_len,framework_name);
    io::Printer::Sub::Sub<std::__cxx11::string>(&local_770,&local_798,&local_7c0);
    local_778 = &local_6b8;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_7f0,"maybe_default_cpp_symbol",&local_7f1);
    local_808.default_cpp_symbol = (bool *)((long)&__range4 + 7);
    local_808.p = &stack0xffffffffffffffe8;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::objectivec::ImportWriter::PrintRuntimeImports(google::protobuf::io::Printer*,bool)const::__0>
              (&local_6b8,&local_7f0,&local_808);
    local_778 = &local_600;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_828,"framework_name",&local_829);
    io::Printer::Sub::Sub<char_const*const&>(&local_600,&local_828,&ProtobufLibraryFrameworkName);
    local_778 = &local_548;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_850,"framework_imports",&local_851);
    local_868.p = &stack0xffffffffffffffe8;
    local_868.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::objectivec::ImportWriter::PrintRuntimeImports(google::protobuf::io::Printer*,bool)const::__1>
              (&local_548,&local_850,&local_868);
    local_778 = &local_490;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_888,"raw_imports",&local_889);
    local_8a0.p = &stack0xffffffffffffffe8;
    local_8a0.this = this;
    io::Printer::Sub::
    Sub<google::protobuf::compiler::objectivec::ImportWriter::PrintRuntimeImports(google::protobuf::io::Printer*,bool)const::__2>
              (&local_490,&local_888,&local_8a0);
    local_8a1 = 0;
    local_3d8 = &local_770;
    local_3d0 = 5;
    v._M_len = 5;
    v._M_array = local_3d8;
    absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
    Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
              ((Span<google::protobuf::io::Printer::Sub_const> *)local_3c8._M_local_buf,v);
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              (&local_8b8,
               "\n        $maybe_default_cpp_symbol$\n\n        #if $cpp_symbol$\n         $framework_imports$\n        #else\n         $raw_imports$\n        #endif\n      "
              );
    io::Printer::SourceLocation::current();
    google::protobuf::io::Printer::Emit
              (pPVar1,local_3c8._M_allocated_capacity,local_3c8._8_8_,local_8b8._M_len,
               local_8b8._M_str);
    local_9e0 = (Sub *)&local_3d8;
    do {
      local_9e0 = local_9e0 + -1;
      io::Printer::Sub::~Sub(local_9e0);
    } while (local_9e0 != &local_770);
    std::__cxx11::string::~string((string *)&local_888);
    std::allocator<char>::~allocator(&local_889);
    std::__cxx11::string::~string((string *)&local_850);
    std::allocator<char>::~allocator(&local_851);
    std::__cxx11::string::~string((string *)&local_828);
    std::allocator<char>::~allocator(&local_829);
    std::__cxx11::string::~string((string *)&local_7f0);
    std::allocator<char>::~allocator(&local_7f1);
    std::__cxx11::string::~string((string *)&local_7c0);
    std::__cxx11::string::~string((string *)&local_798);
    std::allocator<char>::~allocator(&local_799);
  }
  else {
    if ((__range4._7_1_ & 1) != 0) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_270,"!default_cpp_symbol");
      absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                (local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O0/_deps/protobuf-src/src/google/protobuf/compiler/objectivec/import_writer.cc"
                 ,0xc1,local_270._M_len,local_270._M_str);
      pLVar4 = absl::lts_20240722::log_internal::LogMessage::InternalStream((LogMessage *)local_260)
      ;
      absl::lts_20240722::log_internal::Voidify::operator&&(local_24b,pLVar4);
      absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_260);
    }
    __end4_1 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(&this->protobuf_imports_);
    header_1 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end(&this->protobuf_imports_);
    while (bVar2 = __gnu_cxx::operator!=
                             (&__end4_1,
                              (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)&header_1), bVar2) {
      local_298 = (undefined1  [8])
                  __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end4_1);
      pPVar1 = pPStack_18;
      local_39a = '\x01';
      local_378 = &local_370;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"header",&local_399);
      io::Printer::Sub::Sub<std::__cxx11::string_const&>
                (&local_370,&local_398,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_298);
      local_39a = '\0';
      local_2b8 = &local_370;
      local_2b0 = 1;
      v_00._M_len = 1;
      v_00._M_array = local_2b8;
      absl::lts_20240722::Span<google::protobuf::io::Printer::Sub_const>::
      Span<google::protobuf::io::Printer::Sub_const,google::protobuf::io::Printer::Sub_const>
                ((Span<google::protobuf::io::Printer::Sub_const> *)local_2a8._M_local_buf,v_00);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                (&local_3b0,"\n                #import \"$header$\"\n              ");
      io::Printer::SourceLocation::current();
      google::protobuf::io::Printer::Emit
                (pPVar1,local_2a8._M_allocated_capacity,local_2a8._8_8_,local_3b0._M_len,
                 local_3b0._M_str);
      local_950 = (Sub *)&local_2b8;
      do {
        local_950 = local_950 + -1;
        io::Printer::Sub::~Sub(local_950);
      } while (local_950 != &local_370);
      std::__cxx11::string::~string((string *)&local_398);
      std::allocator<char>::~allocator(&local_399);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end4_1);
    }
  }
  return;
}

Assistant:

void ImportWriter::PrintRuntimeImports(io::Printer* p,
                                       bool default_cpp_symbol) const {
  // Given an override, use that.
  if (!runtime_import_prefix_.empty()) {
    for (const auto& header : protobuf_imports_) {
      p->Emit({{"import_prefix", runtime_import_prefix_}, {"header", header}},
              R"objc(
                #import "$import_prefix$/$header$"
              )objc");
    }
    return;
  }

  // If bundled, no need to do the framework support below.
  if (for_bundled_proto_) {
    ABSL_DCHECK(!default_cpp_symbol);
    for (const auto& header : protobuf_imports_) {
      p->Emit({{"header", header}},
              R"objc(
                #import "$header$"
              )objc");
    }
    return;
  }

  p->Emit(
      {
          {"cpp_symbol",
           ProtobufFrameworkImportSymbol(ProtobufLibraryFrameworkName)},
          {"maybe_default_cpp_symbol",
           [&] {
             if (default_cpp_symbol) {
               p->Emit(
                   R"objc(
                     // This CPP symbol can be defined to use imports that match up to the framework
                     // imports needed when using CocoaPods.
                     #if !defined($cpp_symbol$)
                      #define $cpp_symbol$ 0
                     #endif
                   )objc");
             }
           }},
          {"framework_name", ProtobufLibraryFrameworkName},
          {"framework_imports",
           [&] {
             for (const auto& header : protobuf_imports_) {
               p->Emit({{"header", header}},
                       R"objc(
                         #import <$framework_name$/$header$>
                       )objc");
             }
           }},
          {"raw_imports",
           [&] {
             for (const auto& header : protobuf_imports_) {
               p->Emit({{"header", header}},
                       R"objc(
                         #import "$header$"
                       )objc");
             }
           }},
      },
      R"objc(
        $maybe_default_cpp_symbol$

        #if $cpp_symbol$
         $framework_imports$
        #else
         $raw_imports$
        #endif
      )objc");
}